

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCBufferedWriter.cpp
# Opt level: O0

int32_t __thiscall gnilk::IPCBufferedWriter::Flush(IPCBufferedWriter *this)

{
  IPCWriter *pIVar1;
  int iVar2;
  uchar *puVar3;
  size_type sVar4;
  int32_t res;
  IPCBufferedWriter *this_local;
  
  pIVar1 = this->writer;
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
  iVar2 = (**pIVar1->_vptr_IPCWriter)(pIVar1,puVar3,sVar4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->data);
  return iVar2;
}

Assistant:

int32_t IPCBufferedWriter::Flush() {
    auto res = writer.Write(data.data(), data.size());
    data.clear();
    return res;
}